

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  curl_slist *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  char *pcVar11;
  Curl_addrinfo *pCVar12;
  curl_slist **ppcVar13;
  int port;
  Curl_addrinfo *local_1a0;
  char *local_198;
  Curl_addrinfo *local_190;
  char *local_188;
  curl_slist **local_180;
  char hostname [256];
  char address [64];
  
  port = 0;
  (data->change).wildcard_resolve = false;
  ppcVar13 = &(data->change).resolve;
  local_180 = ppcVar13;
  do {
    pcVar1 = *ppcVar13;
    if (pcVar1 == (curl_slist *)0x0) {
      *local_180 = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar1->data;
    if (pcVar3 != (char *)0x0) {
      if (*pcVar3 == '-') {
        iVar2 = __isoc99_sscanf(pcVar3 + 1,"%255[^:]:%d",hostname,&port);
        if (iVar2 == 2) {
          pcVar3 = create_hostcache_id(hostname,port);
          if (pcVar3 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar4 = strlen(pcVar3);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar3);
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar1->data);
        }
      }
      else {
        pcVar5 = strchr(pcVar3,0x3a);
        if ((pcVar5 == (char *)0x0) || (0xff < (long)pcVar5 - (long)pcVar3)) {
LAB_0010bb10:
          pCVar12 = (Curl_addrinfo *)0x0;
          pcVar7 = local_198;
        }
        else {
          memcpy(hostname,pcVar3,(long)pcVar5 - (long)pcVar3);
          pcVar5[(long)(hostname + -(long)pcVar1->data)] = '\0';
          uVar6 = strtoul(pcVar5 + 1,&local_198,10);
          if ((0xffff < uVar6) || (local_198 == pcVar5 + 1)) goto LAB_0010bb10;
          if (*local_198 == ':') {
            port = (int)uVar6;
            local_188 = local_198 + 1;
            pcVar3 = local_198;
            pCVar12 = (Curl_addrinfo *)0x0;
            pCVar8 = (Curl_addrinfo *)0x0;
            while (local_190 = pCVar8, local_1a0 = pCVar12, pCVar12 = local_1a0, *pcVar3 != '\0') {
              pcVar5 = pcVar3 + 1;
              pcVar7 = strchr(pcVar5,0x2c);
              if (pcVar7 == (char *)0x0) {
                sVar4 = strlen(pcVar5);
                pcVar7 = pcVar5 + sVar4;
              }
              pcVar11 = pcVar7;
              pCVar12 = local_1a0;
              if (*pcVar5 == '[') {
                if ((pcVar7 == pcVar5) || (pcVar7[-1] != ']')) goto LAB_0010bb15;
                pcVar5 = pcVar3 + 2;
                pcVar11 = pcVar7 + -1;
              }
              uVar6 = (long)pcVar11 - (long)pcVar5;
              pcVar3 = pcVar7;
              pCVar8 = local_190;
              if (uVar6 != 0) {
                if (0x3f < uVar6) goto LAB_0010bb15;
                memcpy(address,pcVar5,uVar6);
                address[uVar6] = '\0';
                pCVar8 = Curl_str2addr(address,port);
                if (pCVar8 == (Curl_addrinfo *)0x0) {
                  local_198 = pcVar7;
                  Curl_infof(data,"Resolve address \'%s\' found illegal!\n",address);
                  pCVar12 = local_1a0;
                  pcVar7 = local_198;
                  goto LAB_0010bb15;
                }
                pCVar12 = pCVar8;
                if (local_190 != (Curl_addrinfo *)0x0) {
                  local_190->ai_next = pCVar8;
                  pCVar12 = local_1a0;
                }
              }
            }
            local_198 = pcVar3;
            if (local_1a0 != (Curl_addrinfo *)0x0) {
              pcVar3 = create_hostcache_id(hostname,port);
              if (pcVar3 == (char *)0x0) {
LAB_0010bd1e:
                Curl_freeaddrinfo(pCVar12);
                return CURLE_OUT_OF_MEMORY;
              }
              sVar4 = strlen(pcVar3);
              if (data->share != (Curl_share *)0x0) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pvVar9 = Curl_hash_pick((data->dns).hostcache,pcVar3,sVar4 + 1);
              if (pvVar9 != (void *)0x0) {
                Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded!\n",hostname,
                           (ulong)(uint)port);
                Curl_hash_delete((data->dns).hostcache,pcVar3,sVar4 + 1);
              }
              (*Curl_cfree)(pcVar3);
              pCVar10 = Curl_cache_addr(data,local_1a0,hostname,port);
              if (pCVar10 != (Curl_dns_entry *)0x0) {
                pCVar10->timestamp = 0;
                pCVar10->inuse = pCVar10->inuse + -1;
              }
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
              pCVar12 = local_1a0;
              if (pCVar10 == (Curl_dns_entry *)0x0) goto LAB_0010bd1e;
              Curl_infof(data,"Added %s:%d:%s to DNS cache\n",hostname,(ulong)(uint)port,local_188);
              if ((hostname[0] == '*') && (hostname[1] == '\0')) {
                Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks\n",hostname,
                           (ulong)(uint)port);
                (data->change).wildcard_resolve = true;
              }
              goto LAB_0010bb49;
            }
            goto LAB_0010bb10;
          }
          pCVar12 = (Curl_addrinfo *)0x0;
          pcVar7 = local_198;
        }
LAB_0010bb15:
        local_198 = pcVar7;
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar1->data);
        Curl_freeaddrinfo(pCVar12);
      }
    }
LAB_0010bb49:
    ppcVar13 = &pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->change.wildcard_resolve = false;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded!\n",
                hostname, port);
        /* delete old entry entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as added by CURLOPT_RESOLVE. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }
      /* free the allocated entry_id again */
      free(entry_id);

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
            dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks\n",
              hostname, port);
        data->change.wildcard_resolve = true;
      }
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}